

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blif_parser.cpp
# Opt level: O3

void __thiscall BFunction::~BFunction(BFunction *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::vector<Terms,_std::allocator<Terms>_>::~vector(&this->_inputs);
  pcVar1 = (this->_output)._M_dataplus._M_p;
  paVar2 = &(this->_output).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

BFunction(string output) {
    this->_output = output;
  }